

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeCharacter(ExpressionContext *ctx,SynCharacter *syntax)

{
  ExprBase *this;
  uchar local_19;
  uchar result;
  SynCharacter *syntax_local;
  ExpressionContext *ctx_local;
  
  local_19 = (syntax->value).begin[1];
  if (local_19 == '\\') {
    local_19 = anon_unknown.dwarf_6f1cc::ParseEscapeSequence
                         (ctx,&syntax->super_SynBase,(syntax->value).begin + 1);
  }
  this = &ExpressionContext::get<ExprCharacterLiteral>(ctx)->super_ExprBase;
  ExprCharacterLiteral::ExprCharacterLiteral
            ((ExprCharacterLiteral *)this,&syntax->super_SynBase,ctx->typeChar,local_19);
  return this;
}

Assistant:

ExprBase* AnalyzeCharacter(ExpressionContext &ctx, SynCharacter *syntax)
{
	unsigned char result = (unsigned char)syntax->value.begin[1];

	if(result == '\\')
		result = ParseEscapeSequence(ctx, syntax, syntax->value.begin + 1);

	return new (ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(syntax, ctx.typeChar, result);
}